

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cleanup_state.cpp
# Opt level: O2

void __thiscall duckdb::CleanupState::Flush(CleanupState *this)

{
  DataTable *this_00;
  LogicalType local_90;
  Vector row_identifiers;
  
  if (this->count != 0) {
    LogicalType::LogicalType(&local_90,BIGINT);
    Vector::Vector(&row_identifiers,&local_90,(data_ptr_t)this->row_numbers);
    LogicalType::~LogicalType(&local_90);
    this_00 = optional_ptr<duckdb::DataTable,_true>::operator->(&this->current_table);
    DataTable::RemoveFromIndexes(this_00,&row_identifiers,this->count);
    this->count = 0;
    Vector::~Vector(&row_identifiers);
  }
  return;
}

Assistant:

void CleanupState::Flush() {
	if (count == 0) {
		return;
	}

	// set up the row identifiers vector
	Vector row_identifiers(LogicalType::ROW_TYPE, data_ptr_cast(row_numbers));

	// delete the tuples from all the indexes
	try {
		current_table->RemoveFromIndexes(row_identifiers, count);
	} catch (...) { // NOLINT: ignore errors here
	}

	count = 0;
}